

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O1

void ARGBQuantizeRow_C(uint8_t *dst_argb,int scale,int interval_size,int interval_offset,int width)

{
  byte bVar1;
  byte bVar2;
  char cVar3;
  char cVar4;
  long lVar5;
  
  if (0 < width) {
    lVar5 = 0;
    do {
      bVar1 = dst_argb[lVar5 * 4 + 1];
      bVar2 = dst_argb[lVar5 * 4 + 2];
      cVar4 = (char)interval_size;
      cVar3 = (char)interval_offset;
      dst_argb[lVar5 * 4] = (char)((uint)dst_argb[lVar5 * 4] * scale >> 0x10) * cVar4 + cVar3;
      dst_argb[lVar5 * 4 + 1] = (char)((uint)bVar1 * scale >> 0x10) * cVar4 + cVar3;
      dst_argb[lVar5 * 4 + 2] = (char)((uint)bVar2 * scale >> 0x10) * cVar4 + cVar3;
      lVar5 = lVar5 + 1;
    } while (width != (int)lVar5);
  }
  return;
}

Assistant:

void ARGBQuantizeRow_C(uint8_t* dst_argb,
                       int scale,
                       int interval_size,
                       int interval_offset,
                       int width) {
  int x;
  for (x = 0; x < width; ++x) {
    int b = dst_argb[0];
    int g = dst_argb[1];
    int r = dst_argb[2];
    dst_argb[0] = (b * scale >> 16) * interval_size + interval_offset;
    dst_argb[1] = (g * scale >> 16) * interval_size + interval_offset;
    dst_argb[2] = (r * scale >> 16) * interval_size + interval_offset;
    dst_argb += 4;
  }
}